

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O1

void __thiscall
XPMP2::SoundSystemXP::SetPosOrientation
          (SoundSystemXP *this,uint64_t sndId,Aircraft *ac,bool bDoOrientation)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  SoundFile *pSVar5;
  undefined1 auVar6 [16];
  FMOD_RESULT FVar7;
  SoundChannel *pSVar8;
  undefined4 uVar9;
  int iVar10;
  undefined7 in_register_00000009;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  float fVar12;
  float fVar13;
  valarray<float> v;
  string local_138;
  string local_118;
  string local_f8;
  undefined1 local_d8 [24];
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined8 local_60;
  undefined4 local_58;
  undefined8 local_50;
  float local_48;
  undefined8 local_40;
  float local_38;
  
  uVar9 = (undefined4)CONCAT71(in_register_00000009,bDoOrientation);
  pSVar8 = SoundSystem::GetChn(&this->super_SoundSystem,sndId);
  if ((((pSVar8 != (SoundChannel *)0x0) && (gpXPLMSetAudioCone != (code *)0x0)) &&
      (pSVar8->pChn != (FMOD_CHANNEL *)0x0)) && (pSVar8->pSnd != (SoundFile *)0x0)) {
    local_40._0_4_ = (ac->drawInfo).x;
    local_40._4_4_ = (ac->drawInfo).y;
    local_38 = (ac->drawInfo).z;
    local_50._0_4_ = ac->v_x;
    local_50._4_4_ = ac->v_y;
    local_48 = ac->v_z;
    gFmodRes = (*gpXPLMSetAudioPosition)(pSVar8->pChn);
    if (gFmodRes != FMOD_OK) {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"gpXPLMSetAudioPosition(pChn->pChn, &fmodPos, &fmodVel)","");
      FVar7 = gFmodRes;
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
                 ,"");
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"SetPosOrientation","");
      FmodError::FmodError((FmodError *)local_d8,&local_138,FVar7,&local_f8,0x249,&local_118);
      FmodError::LogErr((FmodError *)local_d8);
      paVar11 = &local_88;
      local_d8._0_8_ = &PTR__FmodError_002e0a18;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_p != paVar11) {
        operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
      }
      uVar9 = SUB84(paVar11,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_p != &local_b0) {
        operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
      }
      std::runtime_error::~runtime_error((runtime_error *)local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
    }
    if (bDoOrientation) {
      pSVar5 = pSVar8->pSnd;
      fStack_74 = pSVar5->conePitch;
      fStack_70 = pSVar5->coneInAngle;
      fStack_6c = pSVar5->coneOutAngle;
      auVar6._4_4_ = -(uint)NAN(fStack_74);
      auVar6._0_4_ = -(uint)NAN(pSVar5->coneDir);
      auVar6._8_4_ = -(uint)NAN(fStack_70);
      auVar6._12_4_ = -(uint)NAN(fStack_6c);
      iVar10 = movmskps(uVar9,auVar6);
      if ((iVar10 == 0) && (!NAN(pSVar5->coneOutVol))) {
        local_78 = (pSVar5->coneDir * 3.1415927) / 180.0;
        fVar1 = (ac->drawInfo).heading;
        fVar2 = pSVar8->pSnd->coneDir;
        fVar12 = cosf(local_78);
        fVar3 = (ac->drawInfo).pitch;
        fVar13 = sinf(local_78);
        HeadPitch2Vec((XPMP2 *)local_d8,fVar1 + fVar2,
                      (fVar12 * fVar3 - fVar13 * (ac->drawInfo).roll) + pSVar8->pSnd->conePitch);
        uVar4 = *(undefined8 *)local_d8._8_8_;
        uVar9 = *(undefined4 *)(local_d8._8_8_ + 8);
        operator_delete((void *)local_d8._8_8_);
        pSVar5 = pSVar8->pSnd;
        local_60 = uVar4;
        local_58 = uVar9;
        gFmodRes = (*gpXPLMSetAudioCone)
                             (pSVar5->coneInAngle,pSVar5->coneOutAngle,pSVar5->coneOutVol,
                              pSVar8->pChn);
        if (gFmodRes != FMOD_OK) {
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_138,
                     "gpXPLMSetAudioCone(pChn->pChn, pChn->pSnd->coneInAngle, pChn->pSnd->coneOutAngle, pChn->pSnd->coneOutVol, &coneVec)"
                     ,"");
          FVar7 = gFmodRes;
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f8,
                     "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
                     ,"");
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_118,"SetPosOrientation","");
          FmodError::FmodError((FmodError *)local_d8,&local_138,FVar7,&local_f8,0x259,&local_118);
          FmodError::LogErr((FmodError *)local_d8);
          local_d8._0_8_ = &PTR__FmodError_002e0a18;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_p != &local_88) {
            operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_p != &local_b0) {
            operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
          }
          std::runtime_error::~runtime_error((runtime_error *)local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void SoundSystemXP::SetPosOrientation (uint64_t sndId, const Aircraft& ac, bool bDoOrientation)
{
    SoundChannel* pChn = GetChn(sndId);
    if (!XPSoundIsAvail() || !pChn || !pChn->pChn || !pChn->pSnd ) return;
    
    // Aircraft position and velocity
    FMOD_VECTOR fmodPos {                           // Copy of the aircraft's 3D location
        ac.drawInfo.x,
        ac.drawInfo.y,
        ac.drawInfo.z,
    };
    FMOD_VECTOR fmodVel { ac.v_x, ac.v_y, ac.v_z }; // Copy of the aircraft's relative speed
    FMOD_LOG(gpXPLMSetAudioPosition(pChn->pChn, &fmodPos, &fmodVel));
    
    // Do the (computationally more expensive) orientation stuff?
    if (!bDoOrientation ||
        !pChn->pSnd->hasConeInfo()) return;
    
    // Calculate current cone orientation based on standard orientation and aircraft orientation
    const float coneDirRad = deg2rad(pChn->pSnd->coneDir);
    FMOD_VECTOR coneVec = FmodHeadPitch2Vec(ac.GetHeading() + pChn->pSnd->coneDir,
                                            std::cos(coneDirRad)*ac.GetPitch() - std::sin(coneDirRad)*ac.GetRoll() + pChn->pSnd->conePitch);

    // Set cone info and orientation
    FMOD_LOG(gpXPLMSetAudioCone(pChn->pChn,
                                pChn->pSnd->coneInAngle,
                                pChn->pSnd->coneOutAngle,
                                pChn->pSnd->coneOutVol,
                                &coneVec));
}